

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O3

void cfd::TransactionContextUtil::AddSign<cfd::TransactionContext>
               (TransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
               bool insert_witness,bool clear_stack)

{
  pointer pSVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  undefined4 uVar5;
  uint uVar6;
  CfdException *pCVar7;
  pointer pSVar8;
  pointer pSVar9;
  byte bVar10;
  ScriptElement *element;
  ScriptOperator op_code;
  ScriptBuilder builder;
  Txid txid;
  Script script;
  undefined1 local_170 [16];
  char *local_160 [2];
  _func_int *local_150 [2];
  Script local_140;
  Script local_e0;
  undefined **local_a8;
  void *local_a0;
  undefined **local_88;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_80;
  Script local_68;
  
  if (transaction == (TransactionContext *)0x0) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Empty transaction.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_170);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_170._0_8_ = "cfd_transaction_internal.cpp";
    local_170._8_4_ = kOpSuccess252;
    local_160[0] = "AddSign";
    core::logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "Failed to AddSign. Empty sign_params.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Empty sign_params.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_170);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cVar2 = cfd::core::OutPoint::IsValid();
  if (cVar2 == '\0') {
    local_170._0_8_ = "cfd_transaction_internal.cpp";
    local_170._8_4_ = 0x101;
    local_160[0] = "AddSign";
    core::logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "Failed to AddSign. Invalid outpoint.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Invalid outpoint.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_170);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (!insert_witness) {
    pSVar8 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar8 != pSVar1) {
      bVar10 = 0;
      do {
        bVar3 = SignParameter::IsOpCode(pSVar8);
        if (bVar3) {
          SignParameter::GetOpCode((ScriptOperator *)local_170,pSVar8);
          bVar4 = cfd::core::ScriptOperator::IsPushOperator();
          local_170._0_8_ = &PTR__ScriptOperator_002b0f30;
          if ((_func_int **)local_160[0] != local_150) {
            operator_delete(local_160[0]);
          }
          bVar10 = bVar10 | bVar4;
        }
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar1);
      goto LAB_001c9c9c;
    }
  }
  bVar10 = 0;
LAB_001c9c9c:
  cfd::core::OutPoint::GetTxid();
  uVar5 = cfd::core::OutPoint::GetVout();
  uVar6 = (**(code **)(*(long *)transaction + 0x10))(transaction,&local_a8,uVar5);
  if (insert_witness) {
    if (clear_stack) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll((uint)transaction);
    }
    pSVar8 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar8 != pSVar1) {
      do {
        SignParameter::ConvertToSignature((ByteData *)local_170,pSVar8);
        cfd::core::Transaction::AddScriptWitnessStack((uint)&local_88,(ByteData *)transaction);
        local_88 = &PTR__ScriptWitness_002b0f60;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_80);
        if ((pointer)local_170._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_170._0_8_);
        }
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar1);
    }
  }
  else {
    cfd::core::Script::Script(&local_68);
    if (!clear_stack) {
      cfd::core::Transaction::GetTxIn((uint)local_170);
      cfd::core::Script::Script(&local_e0,&local_140);
      cfd::core::Script::operator=(&local_68,&local_e0);
      core::Script::~Script(&local_e0);
      core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_170);
    }
    local_e0._vptr_Script = (_func_int **)&PTR__ScriptBuilder_002b0fc0;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::Script::GetElementList();
    if ((pointer)local_170._0_8_ != (pointer)CONCAT44(local_170._12_4_,local_170._8_4_)) {
      pSVar9 = (pointer)local_170._0_8_;
      do {
        cfd::core::ScriptBuilder::AppendElement((ScriptElement *)&local_e0);
        pSVar9 = pSVar9 + 0x60;
      } while (pSVar9 != (pointer)CONCAT44(local_170._12_4_,local_170._8_4_));
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_170);
    pSVar8 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar8 != pSVar1) {
      do {
        if (((bVar10 & 1) == 0) || (bVar3 = SignParameter::IsOpCode(pSVar8), !bVar3)) {
          SignParameter::ConvertToSignature((ByteData *)local_170,pSVar8);
          cfd::core::ScriptBuilder::AppendData((ByteData *)&local_e0);
          pSVar9 = (pointer)local_170._0_8_;
          if ((pointer)local_170._0_8_ != (pointer)0x0) goto LAB_001c9ed2;
        }
        else {
          SignParameter::GetOpCode((ScriptOperator *)local_170,pSVar8);
          cfd::core::ScriptBuilder::AppendOperator((ScriptOperator *)&local_e0);
          local_170._0_8_ = &PTR__ScriptOperator_002b0f30;
          pSVar9 = (pointer)local_160[0];
          if ((_func_int **)local_160[0] != local_150) {
LAB_001c9ed2:
            operator_delete(pSVar9);
          }
        }
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar1);
    }
    cfd::core::ScriptBuilder::Build();
    cfd::core::Transaction::SetUnlockingScript((uint)transaction,(Script *)(ulong)uVar6);
    core::Script::~Script((Script *)local_170);
    local_e0._vptr_Script = (_func_int **)&PTR__ScriptBuilder_002b0fc0;
    if (local_e0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::Script::~Script(&local_68);
  }
  local_a8 = &PTR__Txid_002b0f00;
  if (local_a0 != (void *)0x0) {
    operator_delete(local_a0);
  }
  return;
}

Assistant:

void TransactionContextUtil::AddSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& sign_params, bool insert_witness,
    bool clear_stack) {
  if (transaction == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty transaction.");
  }
  if (sign_params.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Empty sign_params.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty sign_params.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_op_code = false;
  if (!insert_witness) {
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        ScriptOperator op_code = sign_param.GetOpCode();
        if (op_code.IsPushOperator()) {
          has_op_code = true;
        }
      }
    }
  }
  Txid txid = outpoint.GetTxid();
  uint32_t vout = outpoint.GetVout();
  uint32_t txin_index = transaction->GetTxInIndex(txid, vout);

  if (insert_witness) {
    if (clear_stack) {
      transaction->RemoveScriptWitnessStackAll(txin_index);
    }
    for (const SignParameter& sign_param : sign_params) {
      transaction->AddScriptWitnessStack(
          txin_index, sign_param.ConvertToSignature());
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = transaction->GetTxIn(txin_index).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (has_op_code && sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    transaction->SetUnlockingScript(txin_index, builder.Build());
  }
}